

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint32_t uVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  pool_ref<soul::heart::Variable> *ppVar6;
  size_t sVar7;
  int iVar8;
  Connection *in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Module *pMVar9;
  Variable *v;
  Function *__fn_00;
  Function *__child_stack_00;
  ulong uVar10;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  pool_ref<soul::heart::InputDeclaration> *io;
  pointer ppVar11;
  pointer ppVar12;
  pointer ppVar13;
  pointer ppVar14;
  long lVar15;
  size_t i;
  ulong index;
  pool_ref<soul::heart::Connection> local_38;
  
  uVar10 = (ulong)(uint)__flags;
  ppVar2 = (this->oldModule->inputs).
           super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.object = in_RAX;
  for (ppVar11 = (this->oldModule->inputs).
                 super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar2; ppVar11 = ppVar11 + 1
      ) {
    pMVar9 = this->newModule;
    iVar8 = clone(this,(__fn *)ppVar11->object,__child_stack,(int)uVar10,__arg);
    local_38.object = (Connection *)CONCAT44(extraout_var,iVar8);
    std::
    vector<soul::pool_ref<soul::heart::InputDeclaration>,std::allocator<soul::pool_ref<soul::heart::InputDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::heart::InputDeclaration>>
              ((vector<soul::pool_ref<soul::heart::InputDeclaration>,std::allocator<soul::pool_ref<soul::heart::InputDeclaration>>>
                *)&pMVar9->inputs,(pool_ref<soul::heart::InputDeclaration> *)&local_38);
    __child_stack = extraout_RDX;
  }
  ppVar3 = (this->oldModule->outputs).
           super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar12 = (this->oldModule->outputs).
                 super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar3; ppVar12 = ppVar12 + 1
      ) {
    pMVar9 = this->newModule;
    iVar8 = clone(this,(__fn *)ppVar12->object,__child_stack,(int)uVar10,__arg);
    local_38.object = (Connection *)CONCAT44(extraout_var_00,iVar8);
    std::
    vector<soul::pool_ref<soul::heart::OutputDeclaration>,std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::heart::OutputDeclaration>>
              ((vector<soul::pool_ref<soul::heart::OutputDeclaration>,std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>>>
                *)&pMVar9->outputs,(pool_ref<soul::heart::OutputDeclaration> *)&local_38);
    __child_stack = extraout_RDX_00;
  }
  pMVar9 = this->oldModule;
  if (pMVar9->moduleType == graphModule) {
    ppVar4 = (pMVar9->processorInstances).
             super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar13 = (pMVar9->processorInstances).
                   super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar4;
        ppVar13 = ppVar13 + 1) {
      pMVar9 = this->newModule;
      iVar8 = clone(this,(__fn *)ppVar13->object,__child_stack,(int)uVar10,__arg);
      local_38.object = (Connection *)CONCAT44(extraout_var_01,iVar8);
      std::
      vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
      ::emplace_back<soul::pool_ref<soul::heart::ProcessorInstance>>
                ((vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
                  *)&pMVar9->processorInstances,
                 (pool_ref<soul::heart::ProcessorInstance> *)&local_38);
      __child_stack = extraout_RDX_01;
    }
    ppVar5 = (this->oldModule->connections).
             super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar14 = (this->oldModule->connections).
                   super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar5;
        ppVar14 = ppVar14 + 1) {
      pMVar9 = this->newModule;
      iVar8 = clone(this,(__fn *)ppVar14->object,__child_stack,(int)uVar10,__arg);
      local_38.object = (Connection *)CONCAT44(extraout_var_02,iVar8);
      std::
      vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
      ::emplace_back<soul::pool_ref<soul::heart::Connection>>
                ((vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
                  *)&pMVar9->connections,&local_38);
      __child_stack = extraout_RDX_02;
    }
    pMVar9 = this->oldModule;
  }
  ppVar6 = (pMVar9->stateVariables).stateVariables.items;
  sVar7 = (pMVar9->stateVariables).stateVariables.numActive;
  for (lVar15 = 0; sVar7 << 3 != lVar15; lVar15 = lVar15 + 8) {
    pMVar9 = this->newModule;
    v = getRemappedVariable(this,*(Variable **)((long)&ppVar6->object + lVar15));
    Module::StateVariables::add(&pMVar9->stateVariables,v);
  }
  for (index = 0; index < (this->oldModule->functions).functions.numActive; index = index + 1) {
    __fn_00 = Module::Functions::at(&this->newModule->functions,index);
    __child_stack_00 = Module::Functions::at(&this->oldModule->functions,index);
    clone(this,(__fn *)__fn_00,__child_stack_00,(int)uVar10,__arg);
  }
  uVar1 = this->oldModule->latency;
  this->newModule->latency = uVar1;
  return uVar1;
}

Assistant:

void clone()
    {
        for (auto& io : oldModule.inputs)
            newModule.inputs.push_back (clone (io));

        for (auto& io : oldModule.outputs)
            newModule.outputs.push_back (clone (io));

        if (oldModule.isGraph())
        {
            for (auto& mi : oldModule.processorInstances)
                newModule.processorInstances.push_back (clone (mi));

            for (auto& c : oldModule.connections)
                newModule.connections.push_back (clone (c));
        }

        for (auto& v : oldModule.stateVariables.get())
            newModule.stateVariables.add (getRemappedVariable (v));

        for (size_t i = 0; i <  oldModule.functions.size(); ++i)
            clone (newModule.functions.at (i), oldModule.functions.at (i));

        newModule.latency = oldModule.latency;
    }